

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_access.c
# Opt level: O0

void ecs_records_update(ecs_world_t *world,ecs_vector_t *entities,ecs_vector_t *records,
                       ecs_table_t *table)

{
  int32_t iVar1;
  void *pvVar2;
  void *pvVar3;
  ecs_record_t *peVar4;
  ecs_record_t **r;
  ecs_entity_t *e;
  int32_t count;
  int32_t i;
  ecs_table_t *table_local;
  ecs_vector_t *records_local;
  ecs_vector_t *entities_local;
  ecs_world_t *world_local;
  
  iVar1 = ecs_vector_count(records);
  pvVar2 = _ecs_vector_first(entities,8,0x10);
  pvVar3 = _ecs_vector_first(records,8,0x10);
  e._4_4_ = 0;
  while( true ) {
    if (iVar1 <= e._4_4_) {
      return;
    }
    peVar4 = ecs_record_ensure(world,*(ecs_entity_t *)((long)pvVar2 + (long)e._4_4_ * 8));
    *(ecs_record_t **)((long)pvVar3 + (long)e._4_4_ * 8) = peVar4;
    _ecs_assert(*(long *)((long)pvVar3 + (long)e._4_4_ * 8) != 0,0xc,(char *)0x0,"r[i] != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/direct_access.c"
                ,0xd1);
    if (*(long *)((long)pvVar3 + (long)e._4_4_ * 8) == 0) break;
    **(undefined8 **)((long)pvVar3 + (long)e._4_4_ * 8) = table;
    *(int *)(*(long *)((long)pvVar3 + (long)e._4_4_ * 8) + 8) = e._4_4_ + 1;
    e._4_4_ = e._4_4_ + 1;
  }
  __assert_fail("r[i] != ((void*)0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/direct_access.c"
                ,0xd1,
                "void ecs_records_update(ecs_world_t *, ecs_vector_t *, ecs_vector_t *, ecs_table_t *)"
               );
}

Assistant:

void ecs_records_update(
    ecs_world_t *world,
    ecs_vector_t *entities,
    ecs_vector_t *records,
    ecs_table_t *table)
{
    int32_t i, count = ecs_vector_count(records);
    ecs_entity_t *e = ecs_vector_first(entities, ecs_entity_t);
    ecs_record_t **r = ecs_vector_first(records, ecs_record_t*);

    for (i = 0; i < count; i ++) {
        r[i] = ecs_record_ensure(world, e[i]);
        ecs_assert(r[i] != NULL, ECS_INTERNAL_ERROR, NULL);

        r[i]->table = table;
        r[i]->row = i + 1;
    }    
}